

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O0

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::scan(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  Expression **ppEVar1;
  bool bVar2;
  LocalGet *pLVar3;
  Block *pBVar4;
  If *pIVar5;
  Loop *pLVar6;
  Try *pTVar7;
  size_t sVar8;
  Expression **ppEVar9;
  TryTable *pTVar10;
  int local_84;
  int i_1;
  ExpressionList *list_1;
  int i;
  ExpressionList *list;
  Block *block;
  LocalSet *local_50;
  LocalSet *set;
  reference local_38;
  uint local_24;
  Expression *pEStack_20;
  Index index;
  Expression *curr;
  Expression **currp_local;
  Scanner *self_local;
  
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  do {
    pEStack_20 = *(Expression **)curr;
    switch(pEStack_20->_id) {
    case InvalidId:
      handle_unreachable("bad id",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalStructuralDominance.cpp"
                         ,0x89);
    case BlockId:
      pBVar4 = Expression::cast<wasm::Block>(pEStack_20);
      bVar2 = IString::is(&(pBVar4->name).super_IString);
      if (bVar2) {
        pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (currp_local,doEndScope(Scanner*,wasm::Expression___,(Expression **)curr);
      }
      sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pBVar4->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      list_1._4_4_ = (int)sVar8;
      while (ppEVar1 = currp_local, list_1._4_4_ = list_1._4_4_ + -1, -1 < list_1._4_4_) {
        ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(pBVar4->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(long)list_1._4_4_);
        pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___(ppEVar1,Expression___,ppEVar9);
      }
      bVar2 = IString::is(&(pBVar4->name).super_IString);
      if (bVar2) {
        doBeginScope(Scanner*,wasm::Expression___((Scanner *)currp_local,(Expression **)curr);
      }
      return;
    case IfId:
      pIVar5 = Expression::cast<wasm::If>(pEStack_20);
      if (pIVar5->ifFalse != (Expression *)0x0) {
        pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (currp_local,doEndScope(Scanner*,wasm::Expression___,(Expression **)curr);
        ppEVar1 = currp_local;
        pIVar5 = Expression::cast<wasm::If>(pEStack_20);
        maybePushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (ppEVar1,Expression___,&pIVar5->ifFalse);
        pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (currp_local,doBeginScope(Scanner*,wasm::Expression___,(Expression **)curr);
      }
      pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                (currp_local,doEndScope(Scanner*,wasm::Expression___,(Expression **)curr);
      ppEVar1 = currp_local;
      pIVar5 = Expression::cast<wasm::If>(pEStack_20);
      pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                (ppEVar1,Expression___,&pIVar5->ifTrue);
      pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                (currp_local,doBeginScope(Scanner*,wasm::Expression___,(Expression **)curr);
      pIVar5 = Expression::cast<wasm::If>(pEStack_20);
      curr = (Expression *)&pIVar5->condition;
      break;
    case LoopId:
      pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                (currp_local,doEndScope(Scanner*,wasm::Expression___,(Expression **)curr);
      doBeginScope(Scanner*,wasm::Expression___((Scanner *)currp_local,(Expression **)curr);
      pLVar6 = Expression::cast<wasm::Loop>(pEStack_20);
      curr = (Expression *)&pLVar6->body;
      break;
    default:
      bVar2 = Properties::isControlFlowStructure(pEStack_20);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        PostWalker<Scanner,_wasm::Visitor<Scanner,_void>_>::scan
                  ((Scanner *)currp_local,(Expression **)curr);
        return;
      }
      __assert_fail("!Properties::isControlFlowStructure(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalStructuralDominance.cpp"
                    ,0xde,
                    "static void wasm::LocalStructuralDominance::LocalStructuralDominance(Function *, Module &, Mode)::Scanner::scan(Scanner *, Expression **)"
                   );
    case LocalGetId:
      pLVar3 = Expression::cast<wasm::LocalGet>(pEStack_20);
      local_24 = pLVar3->index;
      local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)(currp_local + 0x1c),
                            (ulong)local_24);
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_38);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        return;
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 currp_local[0x1b],&local_24);
      return;
    case LocalSetId:
      local_50 = Expression::cast<wasm::LocalSet>(pEStack_20);
      _block = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(currp_local + 0x1c),
                          (ulong)local_50->index);
      bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&block);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (currp_local,doLocalSet(Scanner*,wasm::Expression___,(Expression **)curr);
      }
      curr = (Expression *)&local_50->value;
      break;
    case TryId:
      pTVar7 = Expression::cast<wasm::Try>(pEStack_20);
      sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pTVar7->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      local_84 = (int)sVar8;
      while (local_84 = local_84 + -1, -1 < local_84) {
        pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (currp_local,doEndScope(Scanner*,wasm::Expression___,(Expression **)curr);
        ppEVar1 = currp_local;
        ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(pTVar7->catchBodies).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(long)local_84);
        pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___(ppEVar1,Expression___,ppEVar9);
        pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                  (currp_local,doBeginScope(Scanner*,wasm::Expression___,(Expression **)curr);
      }
      pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                (currp_local,doEndScope(Scanner*,wasm::Expression___,(Expression **)curr);
      doBeginScope(Scanner*,wasm::Expression___((Scanner *)currp_local,(Expression **)curr);
      pTVar7 = Expression::cast<wasm::Try>(pEStack_20);
      curr = (Expression *)&pTVar7->body;
      break;
    case TryTableId:
      pushTask(void(*)(Scanner*,wasm::Expression**)::Expression___
                (currp_local,doEndScope(Scanner*,wasm::Expression___,(Expression **)curr);
      doBeginScope(Scanner*,wasm::Expression___((Scanner *)currp_local,(Expression **)curr);
      pTVar10 = Expression::cast<wasm::TryTable>(pEStack_20);
      curr = (Expression *)&pTVar10->body;
    }
  } while( true );
}

Assistant:

static void scan(Scanner* self, Expression** currp) {
      // Use a loop to avoid recursing on the last child - we can just go
      // straight into a loop iteration for it.
      while (1) {
        Expression* curr = *currp;

        switch (curr->_id) {
          case Expression::Id::InvalidId:
            WASM_UNREACHABLE("bad id");

          // local.get can just be visited immediately, as it has no children.
          case Expression::Id::LocalGetId: {
            auto index = curr->cast<LocalGet>()->index;
            if (!self->localsSet[index]) {
              self->nonDominatingIndices.insert(index);
            }
            return;
          }
          case Expression::Id::LocalSetId: {
            auto* set = curr->cast<LocalSet>();
            if (!self->localsSet[set->index]) {
              self->pushTask(doLocalSet, currp);
            }
            // Immediately continue in the loop.
            currp = &set->value;
            continue;
          }

          // Control flow structures.
          case Expression::Id::BlockId: {
            auto* block = curr->cast<Block>();
            // Blocks with no name are never emitted in the binary format, so do
            // not create a scope for them.
            if (block->name.is()) {
              self->pushTask(Scanner::doEndScope, currp);
            }
            auto& list = block->list;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::scan, &list[i]);
            }
            if (block->name.is()) {
              // Just call the task immediately.
              doBeginScope(self, currp);
            }
            return;
          }
          case Expression::Id::IfId: {
            if (curr->cast<If>()->ifFalse) {
              self->pushTask(Scanner::doEndScope, currp);
              self->maybePushTask(Scanner::scan, &curr->cast<If>()->ifFalse);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            self->pushTask(Scanner::scan, &curr->cast<If>()->ifTrue);
            self->pushTask(Scanner::doBeginScope, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<If>()->condition;
            continue;
          }
          case Expression::Id::LoopId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Loop>()->body;
            continue;
          }
          case Expression::Id::TryId: {
            auto& list = curr->cast<Try>()->catchBodies;
            for (int i = int(list.size()) - 1; i >= 0; i--) {
              self->pushTask(Scanner::doEndScope, currp);
              self->pushTask(Scanner::scan, &list[i]);
              self->pushTask(Scanner::doBeginScope, currp);
            }
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the loop.
            currp = &curr->cast<Try>()->body;
            continue;
          }
          case Expression::Id::TryTableId: {
            self->pushTask(Scanner::doEndScope, currp);
            // Just call the task immediately.
            doBeginScope(self, currp);
            // Immediately continue in the try_table.
            currp = &curr->cast<TryTable>()->body;
            continue;
          }

          default: {
            // Control flow structures have been handled. This is an expression,
            // which we scan normally.
            assert(!Properties::isControlFlowStructure(curr));
            PostWalker<Scanner>::scan(self, currp);
            return;
          }
        }
      }
    }